

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

Parser * Catch::Clara::operator|(Parser *__return_storage_ptr__,Parser *p,ExeName *rhs)

{
  ExeName::operator=(&p->m_exeName,rhs);
  Parser::Parser(__return_storage_ptr__,p);
  return __return_storage_ptr__;
}

Assistant:

Parser operator|( Parser&& p, T&& rhs ) {
                p |= CATCH_FORWARD(rhs);
                return CATCH_MOVE(p);
            }